

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

JointIndex __thiscall iDynTree::Model::getJointIndex(Model *this,string *jointName)

{
  pointer __s1;
  size_t __n;
  JointIndex JVar1;
  int iVar2;
  ostream *poVar3;
  size_type *psVar4;
  long lVar5;
  long lVar6;
  stringstream ss;
  long *local_1d8;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar5 = (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    __s1 = (jointName->_M_dataplus)._M_p;
    __n = jointName->_M_string_length;
    psVar4 = &((this->jointNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    lVar6 = 0;
    do {
      if (__n == *psVar4) {
        if (__n == 0) {
          return lVar6;
        }
        iVar2 = bcmp(__s1,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar4 + -1))->_M_dataplus)._M_p,__n);
        if (iVar2 == 0) {
          return lVar6;
        }
      }
      lVar6 = lVar6 + 1;
      psVar4 = psVar4 + 4;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"jointName ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(jointName->_M_dataplus)._M_p,jointName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found in the model.",0x18);
  std::__cxx11::stringbuf::str();
  iDynTree::reportError("Model","getJointIndex",(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  JVar1 = JOINT_INVALID_INDEX;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return JVar1;
}

Assistant:

JointIndex Model::getJointIndex(const std::string& jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return i;
        }
    }

    std::stringstream ss;
    ss << "jointName " << jointName << " not found in the model.";
    reportError("Model","getJointIndex",ss.str().c_str());

    return JOINT_INVALID_INDEX;
}